

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test::
ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test
          (ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test *this)

{
  ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__ModelFlattening_cascadedUnitsManuallyImportedMissingUnitReferences_Test_001a3c70;
  return;
}

Assistant:

TEST(ModelFlattening, cascadedUnitsManuallyImportedMissingUnitReferences)
{
    const std::string e = "The model is not fully defined.";

    auto importer = libcellml::Importer::create();

    auto model = libcellml::Model::create("model");
    auto importModel1 = libcellml::Model::create("importModel1");
    auto importModel2 = libcellml::Model::create("importModel2");

    auto firstUnits = libcellml::Units::create("first_units");
    firstUnits->addUnit("second", -1.0);
    firstUnits->addUnit("units1_import");

    auto secondUnits = libcellml::Units::create("second_units");
    secondUnits->addUnit("second", -2.0);
    secondUnits->addUnit("units2_import");

    auto thirdUnits = libcellml::Units::create("third_units");
    thirdUnits->addUnit("second", -0.5);
    thirdUnits->addUnit("");
    thirdUnits->addUnit("missing_units");

    auto component1 = libcellml::Component::create("base_component");
    auto variable = libcellml::Variable::create("variable");
    variable->setUnits(firstUnits);
    component1->addVariable(variable);

    model->addUnits(firstUnits);
    model->addComponent(component1);

    auto importedUnits1 = libcellml::Units::create("units1_import");
    auto importedUnits2 = libcellml::Units::create("units2_import");

    model->addUnits(importedUnits1);
    importModel1->addUnits(secondUnits);
    importModel1->addUnits(importedUnits2);
    importModel2->addUnits(thirdUnits);

    auto printer = libcellml::Printer::create();

    auto importSource1 = libcellml::ImportSource::create();
    importSource1->setUrl("model1.cellml");
    importSource1->setModel(importModel1);

    auto importSource2 = libcellml::ImportSource::create();
    importSource2->setUrl("model2.cellml");
    importSource2->setModel(importModel2);

    importedUnits1->setImportSource(importSource1);
    importedUnits1->setImportReference("second_units");

    importedUnits2->setImportSource(importSource2);
    importedUnits2->setImportReference("third_units");

    EXPECT_FALSE(model->hasUnresolvedImports());
    EXPECT_FALSE(model->isDefined());

    importer->addModel(importModel1, "model1.cellml");
    importer->addModel(importModel2, "model2.cellml");

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}